

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void DenseMatvec(DlsMat A,realtype *x,realtype *y)

{
  realtype *y_local;
  realtype *x_local;
  DlsMat A_local;
  
  denseMatvec(A->cols,x,y,A->M,A->N);
  return;
}

Assistant:

void DenseMatvec(DlsMat A, realtype *x, realtype *y)
{
  denseMatvec(A->cols, x, y, A->M, A->N);
}